

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

wchar_t parse_cmd(EditLine *el,wchar_t *cmd)

{
  el_bindings_t *peVar1;
  int iVar2;
  long lVar3;
  el_bindings_t *peVar4;
  
  lVar3 = (el->el_map).nfunc + 1;
  peVar1 = (el->el_map).help;
  do {
    peVar4 = peVar1;
    lVar3 = lVar3 + -1;
    if (lVar3 == 0) {
      return L'\xffffffff';
    }
    iVar2 = wcscmp(peVar4->name,cmd);
    peVar1 = peVar4 + 1;
  } while (iVar2 != 0);
  return peVar4->func;
}

Assistant:

libedit_private int
parse_cmd(EditLine *el, const wchar_t *cmd)
{
	el_bindings_t *b = el->el_map.help;
	size_t i;

	for (i = 0; i < el->el_map.nfunc; i++)
		if (wcscmp(b[i].name, cmd) == 0)
			return b[i].func;
	return -1;
}